

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O2

double ApprovalFileLog::log(double __x)

{
  ostream *poVar1;
  string *in_RDI;
  double dVar2;
  string local_230 [32];
  ofstream ofs;
  
  initialize();
  getLogFilePath_abi_cxx11_();
  std::ofstream::ofstream(&ofs,local_230,_S_app);
  std::__cxx11::string::~string(local_230);
  poVar1 = std::operator<<((ostream *)&ofs,in_RDI);
  std::endl<char,std::char_traits<char>>(poVar1);
  dVar2 = (double)std::ofstream::~ofstream(&ofs);
  return dVar2;
}

Assistant:

void ApprovalFileLog::log(const std::string& filePath)
{
    initialize();
    std::ofstream ofs(getLogFilePath(), std::ios::app);
    ofs << filePath << std::endl;
}